

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_handshake(ptls_iovec_t ticket,int use_early_data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ptls_context_t *ppVar7;
  ulong uVar8;
  int iVar9;
  ptls_t *ppVar10;
  ptls_t *ppVar11;
  undefined8 uVar12;
  ptls_t *ppVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ptls_buffer_t cbuf;
  size_t consumed;
  ptls_buffer_t sbuf;
  ptls_buffer_t decbuf;
  size_t max_early_data_size;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  undefined1 local_c0e8 [16];
  undefined1 local_c0d8 [16];
  ulong local_c0c0;
  undefined1 local_c0b8 [16];
  undefined1 local_c0a8 [16];
  undefined1 local_c098 [16];
  undefined1 local_c088 [16];
  ptls_t *local_c070;
  size_t local_c068;
  ptls_t *local_c060;
  ptls_handshake_properties_t local_c058;
  undefined1 local_c038 [16384];
  undefined1 local_8038 [16384];
  undefined1 local_4038 [16392];
  
  local_c088._12_4_ = SUB84(local_c088._0_8_,4);
  local_c0a8._12_4_ = SUB84(local_c0a8._0_8_,4);
  local_c0d8._12_4_ = SUB84(local_c0d8._0_8_,4);
  local_c058.client.session_ticket.len = ticket.len;
  local_c058.client.session_ticket.base = ticket.base;
  local_c058.client.max_early_data_size = (size_t *)0x0;
  local_c058._24_1_ = local_c058._24_1_ & 0xfe;
  local_c068 = 0;
  ppVar10 = ptls_new(ctx,"example.com");
  ppVar7 = ctx_peer;
  ppVar11 = (ptls_t *)malloc(0x130);
  ppVar13 = (ptls_t *)0x0;
  if (ppVar11 != (ptls_t *)0x0) {
    memset(&ppVar11->state,0,0x128);
    ppVar11->ctx = ppVar7;
    ppVar11->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
    ppVar13 = ppVar11;
  }
  local_c0e8._8_8_ = 0x4000;
  local_c0e8._0_8_ = local_4038;
  local_c0d8._0_12_ = ZEXT812(0);
  local_c0b8._8_8_ = 0x4000;
  local_c0b8._0_8_ = local_8038;
  local_c0a8._0_12_ = ZEXT812(0);
  local_c098._8_8_ = 0x4000;
  local_c098._0_8_ = local_c038;
  local_c088._0_12_ = ZEXT812(0);
  if (use_early_data == 0) {
    iVar9 = ptls_handshake(ppVar10,(ptls_buffer_t *)local_c0e8,(void *)0x0,(size_t *)0x0,&local_c058
                          );
    _ok((uint)(iVar9 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x8f);
    bVar14 = local_c0d8._0_8_ != 0;
    uVar12 = 0x90;
  }
  else {
    if (ppVar7->max_early_data_size == 0) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                    ,0x8b,"void test_handshake(ptls_iovec_t, int)");
    }
    local_c058.client.max_early_data_size = &local_c068;
    iVar9 = ptls_handshake(ppVar10,(ptls_buffer_t *)local_c0e8,(void *)0x0,(size_t *)0x0,&local_c058
                          );
    _ok((uint)(iVar9 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x8f);
    _ok((uint)(local_c0d8._0_8_ != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x90);
    if (use_early_data == 0) goto LAB_00112aa5;
    _ok((uint)(local_c068 == ctx_peer->max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x93);
    iVar9 = ptls_send(ppVar10,(ptls_buffer_t *)local_c0e8,"GET / HTTP/1.0\r\n\r\n",0x12);
    bVar14 = iVar9 == 0;
    uVar12 = 0x95;
  }
  _ok((uint)bVar14,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      uVar12);
LAB_00112aa5:
  local_c0c0 = local_c0d8._0_8_;
  local_c060 = ppVar10;
  iVar9 = ptls_handshake(ppVar13,(ptls_buffer_t *)local_c0b8,(void *)local_c0e8._0_8_,&local_c0c0,
                         (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar9 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9a);
  _ok((uint)(local_c0a8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9b);
  uVar8 = local_c0c0;
  local_c070 = ppVar13;
  if (use_early_data == 0) {
    _ok((uint)(local_c0c0 == local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xaf);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_c0d8._8_8_;
    local_c0d8 = auVar2 << 0x40;
  }
  else {
    _ok((uint)(local_c0c0 < (ulong)local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x9e);
    memmove((void *)local_c0e8._0_8_,(uint8_t *)(local_c0e8._0_8_ + uVar8),local_c0d8._0_8_ - uVar8)
    ;
    local_c0c0 = local_c0d8._0_8_ - uVar8;
    local_c0d8._0_8_ = local_c0c0;
    iVar9 = ptls_receive(ppVar13,(ptls_buffer_t *)local_c098,(void *)local_c0e8._0_8_,&local_c0c0);
    _ok((uint)(iVar9 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa4);
    _ok((uint)(local_c0c0 == local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa5);
    uVar12 = local_c088._0_8_;
    _ok((uint)(local_c088._0_8_ == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa6);
    iVar9 = bcmp((void *)local_c098._0_8_,"GET / HTTP/1.0\r\n\r\n",uVar12);
    _ok((uint)(iVar9 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa7);
    _ok((uint)((ppVar13->field_7).server.early_data != (st_ptls_early_data_receiver_t *)0x0),"%s %d"
        ,"/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_c0d8._8_8_;
    local_c0d8 = auVar6 << 0x40;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_c088._8_8_;
    local_c088 = auVar1 << 0x40;
    iVar9 = ptls_send(ppVar13,(ptls_buffer_t *)local_c0b8,"HTTP/1.0 200 OK\r\n\r\nhello world\n",
                      0x1f);
    _ok((uint)(iVar9 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xad);
  }
  ppVar13 = local_c060;
  local_c0c0 = local_c0a8._0_8_;
  iVar9 = ptls_handshake(local_c060,(ptls_buffer_t *)local_c0e8,(void *)local_c0b8._0_8_,&local_c0c0
                         ,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar9 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb5);
  _ok((uint)(local_c0d8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb6);
  uVar8 = local_c0c0;
  if (use_early_data == 0) {
    _ok((uint)(local_c0c0 == local_c0a8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xbd);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_c0a8._8_8_;
    local_c0a8 = auVar3 << 0x40;
    iVar9 = ptls_send(ppVar13,(ptls_buffer_t *)local_c0e8,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar9 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc1);
    ppVar10 = local_c070;
    local_c0c0 = local_c0d8._0_8_;
    iVar9 = ptls_receive(local_c070,(ptls_buffer_t *)local_c098,(void *)local_c0e8._0_8_,&local_c0c0
                        );
    _ok((uint)(iVar9 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc5);
    _ok((uint)(local_c0c0 == local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc6);
    _ok((uint)(local_c088._0_8_ == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        199);
    auVar15[0] = -(*(uint8_t *)local_c098._0_8_ == 'G');
    auVar15[1] = -(*(uint8_t *)(local_c098._0_8_ + 1) == 'E');
    auVar15[2] = -(*(uint8_t *)(local_c098._0_8_ + 2) == 'T');
    auVar15[3] = -(*(uint8_t *)(local_c098._0_8_ + 3) == ' ');
    auVar15[4] = -(*(uint8_t *)(local_c098._0_8_ + 4) == '/');
    auVar15[5] = -(*(uint8_t *)(local_c098._0_8_ + 5) == ' ');
    auVar15[6] = -(*(uint8_t *)(local_c098._0_8_ + 6) == 'H');
    auVar15[7] = -(*(uint8_t *)(local_c098._0_8_ + 7) == 'T');
    auVar15[8] = -(*(uint8_t *)(local_c098._0_8_ + 8) == 'T');
    auVar15[9] = -(*(uint8_t *)(local_c098._0_8_ + 9) == 'P');
    auVar15[10] = -(*(uint8_t *)(local_c098._0_8_ + 10) == '/');
    auVar15[0xb] = -(*(uint8_t *)(local_c098._0_8_ + 0xb) == '1');
    auVar15[0xc] = -(*(uint8_t *)(local_c098._0_8_ + 0xc) == '.');
    auVar15[0xd] = -(*(uint8_t *)(local_c098._0_8_ + 0xd) == '0');
    auVar15[0xe] = -(*(uint8_t *)(local_c098._0_8_ + 0xe) == '\r');
    auVar15[0xf] = -(*(uint8_t *)(local_c098._0_8_ + 0xf) == '\n');
    auVar17[0] = -((char)*(undefined2 *)(local_c098._0_8_ + 0x10) == '\r');
    auVar17[1] = -((char)((ushort)*(undefined2 *)(local_c098._0_8_ + 0x10) >> 8) == '\n');
    auVar17[2] = 0xff;
    auVar17[3] = 0xff;
    auVar17[4] = 0xff;
    auVar17[5] = 0xff;
    auVar17[6] = 0xff;
    auVar17[7] = 0xff;
    auVar17[8] = 0xff;
    auVar17[9] = 0xff;
    auVar17[10] = 0xff;
    auVar17[0xb] = 0xff;
    auVar17[0xc] = 0xff;
    auVar17[0xd] = 0xff;
    auVar17[0xe] = 0xff;
    auVar17[0xf] = 0xff;
    auVar17 = auVar17 & auVar15;
    _ok((uint)((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        200);
    _ok((uint)((ppVar10->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d"
        ,"/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc9);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_c088._8_8_;
    local_c088 = auVar4 << 0x40;
    iVar9 = ptls_send(ppVar10,(ptls_buffer_t *)local_c0b8,"HTTP/1.0 200 OK\r\n\r\nhello world\n",
                      0x1f);
    _ok((uint)(iVar9 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xcd);
  }
  else {
    _ok((uint)(local_c0c0 < (ulong)local_c0a8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xb9);
    memmove((void *)local_c0b8._0_8_,(uint8_t *)(local_c0b8._0_8_ + uVar8),local_c0a8._0_8_ - uVar8)
    ;
    local_c0a8._0_8_ = local_c0a8._0_8_ - uVar8;
    ppVar10 = local_c070;
  }
  local_c0c0 = local_c0a8._0_8_;
  iVar9 = ptls_receive(ppVar13,(ptls_buffer_t *)local_c098,(void *)local_c0b8._0_8_,&local_c0c0);
  _ok((uint)(iVar9 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd2);
  _ok((uint)(local_c0c0 == local_c0a8._0_8_),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd3);
  _ok((uint)(local_c088._0_8_ == 0x1f),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd4);
  auVar16[0] = -(*(uint8_t *)(local_c098._0_8_ + 0xf) == '\r');
  auVar16[1] = -(*(uint8_t *)(local_c098._0_8_ + 0x10) == '\n');
  auVar16[2] = -(*(uint8_t *)(local_c098._0_8_ + 0x11) == '\r');
  auVar16[3] = -(*(uint8_t *)(local_c098._0_8_ + 0x12) == '\n');
  auVar16[4] = -(*(uint8_t *)(local_c098._0_8_ + 0x13) == 'h');
  auVar16[5] = -(*(uint8_t *)(local_c098._0_8_ + 0x14) == 'e');
  auVar16[6] = -(*(uint8_t *)(local_c098._0_8_ + 0x15) == 'l');
  auVar16[7] = -(*(uint8_t *)(local_c098._0_8_ + 0x16) == 'l');
  auVar16[8] = -(*(uint8_t *)(local_c098._0_8_ + 0x17) == 'o');
  auVar16[9] = -(*(uint8_t *)(local_c098._0_8_ + 0x18) == ' ');
  auVar16[10] = -(*(uint8_t *)(local_c098._0_8_ + 0x19) == 'w');
  auVar16[0xb] = -(*(uint8_t *)(local_c098._0_8_ + 0x1a) == 'o');
  auVar16[0xc] = -(*(uint8_t *)(local_c098._0_8_ + 0x1b) == 'r');
  auVar16[0xd] = -(*(uint8_t *)(local_c098._0_8_ + 0x1c) == 'l');
  auVar16[0xe] = -(*(uint8_t *)(local_c098._0_8_ + 0x1d) == 'd');
  auVar16[0xf] = -(*(uint8_t *)(local_c098._0_8_ + 0x1e) == '\n');
  auVar18[0] = -(*(uint8_t *)local_c098._0_8_ == 'H');
  auVar18[1] = -(*(uint8_t *)(local_c098._0_8_ + 1) == 'T');
  auVar18[2] = -(*(uint8_t *)(local_c098._0_8_ + 2) == 'T');
  auVar18[3] = -(*(uint8_t *)(local_c098._0_8_ + 3) == 'P');
  auVar18[4] = -(*(uint8_t *)(local_c098._0_8_ + 4) == '/');
  auVar18[5] = -(*(uint8_t *)(local_c098._0_8_ + 5) == '1');
  auVar18[6] = -(*(uint8_t *)(local_c098._0_8_ + 6) == '.');
  auVar18[7] = -(*(uint8_t *)(local_c098._0_8_ + 7) == '0');
  auVar18[8] = -(*(uint8_t *)(local_c098._0_8_ + 8) == ' ');
  auVar18[9] = -(*(uint8_t *)(local_c098._0_8_ + 9) == '2');
  auVar18[10] = -(*(uint8_t *)(local_c098._0_8_ + 10) == '0');
  auVar18[0xb] = -(*(uint8_t *)(local_c098._0_8_ + 0xb) == '0');
  auVar18[0xc] = -(*(uint8_t *)(local_c098._0_8_ + 0xc) == ' ');
  auVar18[0xd] = -(*(uint8_t *)(local_c098._0_8_ + 0xd) == 'O');
  auVar18[0xe] = -(*(uint8_t *)(local_c098._0_8_ + 0xe) == 'K');
  auVar18[0xf] = -(*(uint8_t *)(local_c098._0_8_ + 0xf) == '\r');
  auVar18 = auVar18 & auVar16;
  _ok((uint)((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd5);
  _ok((uint)((ppVar13->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_c088._8_8_;
  local_c088 = auVar5 << 0x40;
  if (use_early_data != 0) {
    local_c0c0 = local_c0d8._0_8_;
    iVar9 = ptls_receive(ppVar10,(ptls_buffer_t *)local_c098,(void *)local_c0e8._0_8_,&local_c0c0);
    _ok((uint)(iVar9 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdc);
    _ok((uint)(local_c0d8._0_8_ == local_c0c0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdd);
    _ok((uint)(local_c088._0_8_ == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xde);
    _ok((uint)((ppVar13->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d"
        ,"/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdf);
  }
  (*ptls_clear_memory)((void *)local_c0e8._0_8_,local_c0d8._0_8_);
  if (local_c0d8._8_4_ != 0) {
    free((void *)local_c0e8._0_8_);
  }
  local_c0d8 = (undefined1  [16])0x0;
  local_c0e8 = (undefined1  [16])0x0;
  (*ptls_clear_memory)((void *)local_c0b8._0_8_,local_c0a8._0_8_);
  if (local_c0a8._8_4_ != 0) {
    free((void *)local_c0b8._0_8_);
  }
  local_c0a8 = (undefined1  [16])0x0;
  local_c0b8 = (undefined1  [16])0x0;
  uVar12 = local_c098._0_8_;
  (*ptls_clear_memory)((void *)local_c098._0_8_,local_c088._0_8_);
  if (local_c088._8_4_ != 0) {
    free((void *)uVar12);
  }
  local_c088 = (undefined1  [16])0x0;
  local_c098 = (undefined1  [16])0x0;
  ptls_free(ppVar13);
  ptls_free(ppVar10);
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int use_early_data)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{ticket}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    client = ptls_new(ctx, "example.com");
    server = ptls_new(ctx_peer, NULL);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (use_early_data) {
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
    }
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    ok(ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
    }

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);

    if (use_early_data) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(ptls_is_early_data(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;

        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(!ptls_is_early_data(server));
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(!ptls_is_early_data(client));
    decbuf.off = 0;

    if (use_early_data) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(!ptls_is_early_data(client));
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);
}